

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O1

GLvoid __thiscall
gl4cts::anon_unknown_0::GatherBase::CreateTexture2DArrayInt
          (GatherBase *this,int slices,int data_slice)

{
  CallLogWrapper *this_00;
  int i_1;
  int iVar1;
  long lVar2;
  ulong uVar3;
  int i;
  int level;
  allocator_type local_91;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> pixels;
  IVec4 data [4];
  
  iVar1 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])();
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->tex);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,this->tex);
  uVar3 = 0x20;
  level = 0;
  do {
    glu::CallLogWrapper::glTexImage3D
              (this_00,0x8c1a,level,iVar1,(GLsizei)uVar3,(GLsizei)uVar3,slices,0,0x8d99,0x1404,
               (void *)0x0);
    level = level + 1;
    uVar3 = uVar3 >> 1;
  } while (level != 6);
  lVar2 = 0;
  do {
    data[0].m_data[lVar2] = 999;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&pixels,0x400,data,&local_91);
  if (0 < slices) {
    iVar1 = 0;
    do {
      glu::CallLogWrapper::glTexSubImage3D
                (this_00,0x8c1a,0,0,0,iVar1,0x20,0x20,1,0x8d99,0x1404,
                 pixels.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      iVar1 = iVar1 + 1;
    } while (slices != iVar1);
  }
  data[0].m_data[0] = 0xc;
  data[0].m_data[1] = 0xd;
  data[0].m_data[2] = 0xe;
  data[0].m_data[3] = 0xf;
  data[1].m_data[0] = 8;
  data[1].m_data[1] = 9;
  data[1].m_data[2] = 10;
  data[1].m_data[3] = 0xb;
  data[2].m_data[0] = 0;
  data[2].m_data[1] = 1;
  data[2].m_data[2] = 2;
  data[2].m_data[3] = 3;
  data[3].m_data[0] = 4;
  data[3].m_data[1] = 5;
  data[3].m_data[2] = 6;
  data[3].m_data[3] = 7;
  glu::CallLogWrapper::glTexSubImage3D
            (this_00,0x8c1a,0,0x16,0x19,data_slice,2,2,1,0x8d99,0x1404,data);
  glu::CallLogWrapper::glTexSubImage3D(this_00,0x8c1a,0,0x10,10,data_slice,1,1,1,0x8d99,0x1404,data)
  ;
  glu::CallLogWrapper::glTexSubImage3D
            (this_00,0x8c1a,0,0xb,2,data_slice,1,1,1,0x8d99,0x1404,data + 1);
  glu::CallLogWrapper::glTexSubImage3D
            (this_00,0x8c1a,0,0x18,0xd,data_slice,1,1,1,0x8d99,0x1404,data + 2);
  glu::CallLogWrapper::glTexSubImage3D
            (this_00,0x8c1a,0,9,0xe,data_slice,1,1,1,0x8d99,0x1404,data + 3);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x8072,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
  if (pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pixels.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)pixels.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pixels.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

virtual GLvoid CreateTexture2DArrayInt(int slices, int data_slice)
	{
		GLenum		internal_format = InternalFormat();
		const GLint csize			= 32;
		GLint		size			= csize;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D_ARRAY, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			glTexImage3D(GL_TEXTURE_2D_ARRAY, i, internal_format, size, size, slices, 0, GL_RGBA_INTEGER, GL_INT, 0);
		}
		std::vector<IVec4> pixels(csize * csize, IVec4(999));
		for (int i = 0; i < slices; ++i)
		{
			glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 0, 0, i, csize, csize, 1, GL_RGBA_INTEGER, GL_INT, &pixels[0]);
		}

		IVec4 data[4] = { IVec4(12, 13, 14, 15), IVec4(8, 9, 10, 11), IVec4(0, 1, 2, 3), IVec4(4, 5, 6, 7) };

		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 22, 25, data_slice, 2, 2, 1, GL_RGBA_INTEGER, GL_INT, data);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 16, 10, data_slice, 1, 1, 1, GL_RGBA_INTEGER, GL_INT, data + 0);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 11, 2, data_slice, 1, 1, 1, GL_RGBA_INTEGER, GL_INT, data + 1);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 24, 13, data_slice, 1, 1, 1, GL_RGBA_INTEGER, GL_INT, data + 2);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 9, 14, data_slice, 1, 1, 1, GL_RGBA_INTEGER, GL_INT, data + 3);

		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	}